

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ClassSymbols.cpp
# Opt level: O2

ConstraintBlockSymbol *
slang::ast::ConstraintBlockSymbol::fromSyntax(Scope *scope,ConstraintPrototypeSyntax *syntax)

{
  short sVar1;
  Compilation *args;
  pointer pTVar2;
  size_type sVar3;
  SyntaxNode *this;
  ConstraintBlockSymbol *this_00;
  ClassType *type;
  long lVar4;
  span<const_slang::syntax::AttributeInstanceSyntax_*const,_18446744073709551615UL> syntax_00;
  SourceRange sourceRange;
  Token nameToken;
  SourceLocation local_50;
  Token local_48;
  string_view local_38;
  
  args = scope->compilation;
  this = (SyntaxNode *)not_null<slang::syntax::NameSyntax_*>::get(&syntax->name);
  local_48 = slang::syntax::SyntaxNode::getLastToken(this);
  local_38 = parsing::Token::valueText(&local_48);
  local_50 = parsing::Token::location(&local_48);
  this_00 = BumpAllocator::
            emplace<slang::ast::ConstraintBlockSymbol,slang::ast::Compilation&,std::basic_string_view<char,std::char_traits<char>>,slang::SourceLocation>
                      (&args->super_BumpAllocator,args,&local_38,&local_50);
  (this_00->super_Symbol).originatingSyntax = (SyntaxNode *)syntax;
  syntax_00 = slang::syntax::SyntaxList::operator_cast_to_span
                        ((SyntaxList *)&(syntax->super_MemberSyntax).attributes);
  Symbol::setAttributes(&this_00->super_Symbol,scope,syntax_00);
  this_00->isExtern = true;
  pTVar2 = (syntax->qualifiers).super_span<slang::parsing::Token,_18446744073709551615UL>.data_;
  sVar3 = (syntax->qualifiers).super_span<slang::parsing::Token,_18446744073709551615UL>.size_;
  for (lVar4 = 0; sVar3 << 4 != lVar4; lVar4 = lVar4 + 0x10) {
    sVar1 = *(short *)((long)&pTVar2->kind + lVar4);
    if (sVar1 == 0xa8) {
      this_00->isExplicitExtern = true;
    }
    else if (sVar1 == 0xf9) {
      this_00->isPure = true;
    }
    else if (sVar1 == 0x11d) {
      this_00->isStatic = true;
    }
  }
  if (scope->thisSym->kind == ClassType) {
    type = Symbol::as<slang::ast::ClassType>(scope->thisSym);
    if ((this_00->isPure == true) && (type->isAbstract == false)) {
      sourceRange = parsing::Token::range(&local_48);
      Scope::addDiag(scope,(DiagCode)0x870006,sourceRange);
    }
    if (this_00->isStatic == false) {
      addThisVar(this_00,&type->super_Type);
    }
  }
  return this_00;
}

Assistant:

ConstraintBlockSymbol& ConstraintBlockSymbol::fromSyntax(const Scope& scope,
                                                         const ConstraintPrototypeSyntax& syntax) {
    auto& comp = scope.getCompilation();
    auto nameToken = syntax.name->getLastToken();
    auto result = comp.emplace<ConstraintBlockSymbol>(comp, nameToken.valueText(),
                                                      nameToken.location());
    result->setSyntax(syntax);
    result->setAttributes(scope, syntax.attributes);
    result->isExtern = true;

    for (auto qual : syntax.qualifiers) {
        switch (qual.kind) {
            case TokenKind::StaticKeyword:
                result->isStatic = true;
                break;
            case TokenKind::ExternKeyword:
                result->isExplicitExtern = true;
                break;
            case TokenKind::PureKeyword:
                result->isPure = true;
                break;
            default:
                break;
        }
    }

    if (scope.asSymbol().kind == SymbolKind::ClassType) {
        auto& classType = scope.asSymbol().as<ClassType>();
        if (result->isPure && !classType.isAbstract)
            scope.addDiag(diag::PureConstraintInAbstract, nameToken.range());

        if (!result->isStatic)
            result->addThisVar(classType);
    }

    return *result;
}